

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O1

void Abc_ZddManFree(Abc_ZddMan *p)

{
  printf("ZDD stats: Var = %d  Obj = %d  Alloc = %d  Hit = %d  Miss = %d  ",(ulong)(uint)p->nVars,
         (ulong)(uint)p->nObjs,(ulong)(uint)p->nObjsAlloc,
         (ulong)(uint)(p->nCacheLookups - p->nCacheMisses));
  printf("Mem = %.2f MB\n",(double)(int)(p->nMemory >> 0x14) * 4.0);
  if (p->pT2V != (int *)0x0) {
    free(p->pT2V);
    p->pT2V = (int *)0x0;
  }
  if (p->pV2TI != (int *)0x0) {
    free(p->pV2TI);
    p->pV2TI = (int *)0x0;
  }
  if (p->pV2TJ != (int *)0x0) {
    free(p->pV2TJ);
    p->pV2TJ = (int *)0x0;
  }
  if (p->pUnique != (int *)0x0) {
    free(p->pUnique);
    p->pUnique = (int *)0x0;
  }
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  if (p->pCache != (Abc_ZddEnt *)0x0) {
    free(p->pCache);
    p->pCache = (Abc_ZddEnt *)0x0;
  }
  if (p->pObjs != (Abc_ZddObj *)0x0) {
    free(p->pObjs);
    p->pObjs = (Abc_ZddObj *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Abc_ZddManFree( Abc_ZddMan * p )
{
    printf( "ZDD stats: Var = %d  Obj = %d  Alloc = %d  Hit = %d  Miss = %d  ", 
        p->nVars, p->nObjs, p->nObjsAlloc, p->nCacheLookups-p->nCacheMisses, p->nCacheMisses );
    printf( "Mem = %.2f MB\n", 4.0*(int)(p->nMemory/(1<<20)) );
    ABC_FREE( p->pT2V );
    ABC_FREE( p->pV2TI );
    ABC_FREE( p->pV2TJ );
    ABC_FREE( p->pUnique );
    ABC_FREE( p->pNexts );
    ABC_FREE( p->pCache );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}